

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O3

ktx_size_t ktxTexture2_GetDataSizeUncompressed(ktxTexture2 *This)

{
  ktxTexture2_private *pkVar1;
  ktx_uint32_t kVar2;
  uint uVar3;
  long lVar4;
  ktx_size_t kVar5;
  ktx_uint64_t *pkVar6;
  ulong uVar7;
  float fVar8;
  
  if (This->supercompressionScheme - KTX_SS_ZSTD < 2) {
    pkVar1 = This->_private;
    kVar2 = ktxTexture2_calcPostInflationLevelAlignment(This);
    uVar3 = This->numLevels - 1;
    if ((int)uVar3 < 1) {
      lVar4 = 0;
    }
    else {
      uVar7 = (ulong)uVar3 + 1;
      pkVar6 = &pkVar1->_levelIndex[uVar3].uncompressedByteLength;
      lVar4 = 0;
      do {
        fVar8 = ceilf((float)*pkVar6 / (float)kVar2);
        lVar4 = lVar4 + ((long)(fVar8 * (float)kVar2) & 0xffffffffU);
        uVar7 = uVar7 - 1;
        pkVar6 = pkVar6 + -3;
      } while (1 < uVar7);
    }
    kVar5 = lVar4 + pkVar1->_levelIndex[0].uncompressedByteLength;
  }
  else if (This->supercompressionScheme < KTX_SS_ZSTD) {
    kVar5 = This->dataSize;
  }
  else {
    kVar5 = 0;
  }
  return kVar5;
}

Assistant:

ktx_size_t
ktxTexture2_GetDataSizeUncompressed(ktxTexture2* This)
{
    switch (This->supercompressionScheme) {
      case KTX_SS_BASIS_LZ:
      case KTX_SS_NONE:
        return This->dataSize;
      case KTX_SS_ZSTD:
      case KTX_SS_ZLIB:
      {
            ktx_size_t uncompressedSize = 0;
            ktx_uint32_t uncompressedLevelAlignment;
            ktxLevelIndexEntry* levelIndex = This->_private->_levelIndex;

            uncompressedLevelAlignment =
                ktxTexture2_calcPostInflationLevelAlignment(This);

            for (ktx_int32_t level = This->numLevels - 1; level >= 1; level--) {
                ktx_size_t uncompressedLevelSize;
                uncompressedLevelSize = levelIndex[level].uncompressedByteLength;
                uncompressedLevelSize = _KTX_PADN(uncompressedLevelAlignment,
                                                  uncompressedLevelSize);
                uncompressedSize += uncompressedLevelSize;
            }
            uncompressedSize += levelIndex[0].uncompressedByteLength;
            return uncompressedSize;
      }
      case KTX_SS_BEGIN_VENDOR_RANGE:
      case KTX_SS_END_VENDOR_RANGE:
      case KTX_SS_BEGIN_RESERVED:
      default:
        return 0;
    }
}